

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaBinrIO.cpp
# Opt level: O0

void __thiscall NaBinaryStreamFile::AppendRecord(NaBinaryStreamFile *this)

{
  int iVar1;
  undefined4 *puVar2;
  long in_RDI;
  
  iVar1 = fseek(*(FILE **)(in_RDI + 0x20),0,2);
  if (iVar1 != 0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 8;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  if (*(long *)(in_RDI + 0x28) != -1) {
    fwrite(*(void **)(in_RDI + 0x30),*(size_t *)(in_RDI + 0x40),(long)*(int *)(in_RDI + 0x38),
           *(FILE **)(in_RDI + 0x20));
  }
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  return;
}

Assistant:

void
NaBinaryStreamFile::AppendRecord ()
{
  if(0 != fseek(fp, 0, SEEK_END))
    throw(na_write_error);

  if(-1 != iCurLine)
    fwrite(vCurLine, nDataSize, nVar, fp);

  ++iCurLine;
  ++nRecords;
}